

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O1

void __thiscall
TasGrid::GridGlobal::GridGlobal
          (GridGlobal *this,AccelerationContext *acc,GridGlobal *global,int ibegin,int iend)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  DynamicConstructorDataGlobal *args;
  pointer pDVar1;
  pointer *__ptr;
  pointer local_80;
  int local_78;
  int local_74;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  OneDimensionalWrapper *local_38;
  
  BaseCanonicalGrid::BaseCanonicalGrid
            (&this->super_BaseCanonicalGrid,acc,&global->super_BaseCanonicalGrid,ibegin,iend);
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridGlobal_001f61c0;
  this->rule = global->rule;
  this->alpha = global->alpha;
  this->beta = global->beta;
  OneDimensionalWrapper::OneDimensionalWrapper(&this->wrapper,&global->wrapper);
  (this->tensors).cache_num_indexes = (global->tensors).cache_num_indexes;
  (this->tensors).num_dimensions = (global->tensors).num_dimensions;
  this_00 = &(this->tensors).indexes;
  local_74 = ibegin;
  local_38 = &this->wrapper;
  ::std::vector<int,_std::allocator<int>_>::vector(this_00,&(global->tensors).indexes);
  (this->active_tensors).cache_num_indexes = (global->active_tensors).cache_num_indexes;
  (this->active_tensors).num_dimensions = (global->active_tensors).num_dimensions;
  this_01 = &(this->active_tensors).indexes;
  local_78 = iend;
  local_40 = this_00;
  ::std::vector<int,_std::allocator<int>_>::vector(this_01,&(global->active_tensors).indexes);
  local_48 = this_01;
  ::std::vector<int,_std::allocator<int>_>::vector(&this->active_w,&global->active_w);
  local_58 = &this->tensor_refs;
  local_50 = &this->active_w;
  ::std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(local_58,&global->tensor_refs);
  local_60 = &this->max_levels;
  ::std::vector<int,_std::allocator<int>_>::vector(local_60,&global->max_levels);
  (this->updated_tensors).cache_num_indexes = (global->updated_tensors).cache_num_indexes;
  (this->updated_tensors).num_dimensions = (global->updated_tensors).num_dimensions;
  local_68 = &(this->updated_tensors).indexes;
  ::std::vector<int,_std::allocator<int>_>::vector(local_68,&(global->updated_tensors).indexes);
  (this->updated_active_tensors).cache_num_indexes =
       (global->updated_active_tensors).cache_num_indexes;
  (this->updated_active_tensors).num_dimensions = (global->updated_active_tensors).num_dimensions;
  local_70 = &(this->updated_active_tensors).indexes;
  ::std::vector<int,_std::allocator<int>_>::vector
            (local_70,&(global->updated_active_tensors).indexes);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&this->updated_active_w,&global->updated_active_w);
  if (global->rule == rule_customtabulated) {
    CustomTabulated::CustomTabulated(&this->custom,&global->custom);
  }
  else {
    (this->custom).num_levels = 0;
    (this->custom).num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->custom).num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->custom).num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->custom).precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->custom).precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->custom).precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->custom).nodes.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->custom).nodes.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->custom).nodes.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->custom).weights.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->custom).weights.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->custom).weights.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->custom).description._M_dataplus._M_p = (pointer)&(this->custom).description.field_2;
    (this->custom).description._M_string_length = 0;
    (this->custom).description.field_2._M_local_buf[0] = '\0';
  }
  (this->dynamic_values)._M_t.
  super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
  .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl =
       (DynamicConstructorDataGlobal *)0x0;
  (this->gpu_cache)._M_t.
  super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl =
       (CudaGlobalData<double> *)0x0;
  (this->gpu_cachef)._M_t.
  super___uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
  .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl =
       (CudaGlobalData<float> *)0x0;
  args = (global->dynamic_values)._M_t.
         super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
         ._M_t.
         super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
         .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl;
  if (args != (DynamicConstructorDataGlobal *)0x0) {
    Utils::make_unique<TasGrid::DynamicConstructorDataGlobal,TasGrid::DynamicConstructorDataGlobal&>
              ((Utils *)&local_80,args);
    pDVar1 = local_80;
    local_80 = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
    ::reset((__uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
             *)&this->dynamic_values,pDVar1);
    pDVar1 = local_80;
    if (local_80 != (pointer)0x0) {
      ::std::_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::~_Fwd_list_base
                ((_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
                 ((long)local_80 + 0x18));
      ::std::_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>::
      ~_Fwd_list_base((_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> *)
                      ((long)pDVar1 + 0x10));
      operator_delete(pDVar1,0x20);
    }
    if ((this->super_BaseCanonicalGrid).num_outputs != (global->super_BaseCanonicalGrid).num_outputs
       ) {
      DynamicConstructorDataGlobal::restrictData
                ((this->dynamic_values)._M_t.
                 super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                 .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl
                 ,local_74,local_78);
    }
  }
  return;
}

Assistant:

GridGlobal::GridGlobal(AccelerationContext const *acc, GridGlobal const *global, int ibegin, int iend) :
    BaseCanonicalGrid(acc, *global, ibegin, iend),
    rule(global->rule),
    alpha(global->alpha),
    beta(global->beta),
    wrapper(global->wrapper),
    tensors(global->tensors),
    active_tensors(global->active_tensors),
    active_w(global->active_w),
    tensor_refs(global->tensor_refs),
    max_levels(global->max_levels),
    updated_tensors(global->updated_tensors),
    updated_active_tensors(global->updated_active_tensors),
    updated_active_w(global->updated_active_w),
    custom((global->rule == rule_customtabulated) ? global->custom : CustomTabulated()){

    if (global->dynamic_values){
        dynamic_values = Utils::make_unique<DynamicConstructorDataGlobal>(*global->dynamic_values);
        if (num_outputs != global->num_outputs) dynamic_values->restrictData(ibegin, iend);
    }
}